

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O3

void hash_table_rehash(HashTable *ht,int new_size_index)

{
  HashEntry *ptr;
  uint32_t uVar1;
  HashEntry *pHVar2;
  ulong uVar3;
  long lVar4;
  HashEntry *pHVar5;
  
  if (0x1e < new_size_index) {
    return;
  }
  pHVar2 = (HashEntry *)raviX_calloc((ulong)hash_sizes[new_size_index].size,0x18);
  ptr = ht->table;
  uVar3 = (ulong)ht->size;
  ht->table = pHVar2;
  ht->size_index = new_size_index;
  uVar1 = hash_sizes[(uint)new_size_index].rehash;
  ht->size = hash_sizes[(uint)new_size_index].size;
  ht->rehash = uVar1;
  ht->max_entries = hash_sizes[(uint)new_size_index].max_entries;
  ht->entries = 0;
  ht->deleted_entries = 0;
  if (uVar3 != 0) {
    lVar4 = uVar3 * 0x18;
    pHVar2 = ptr;
    do {
      pHVar5 = pHVar2 + 1;
      if ((uint32_t *)pHVar2->key != &deleted_key_value &&
          (uint32_t *)pHVar2->key != (uint32_t *)0x0) {
        raviX_hash_table_insert_pre_hashed(ht,pHVar2->hash,pHVar2->key,pHVar2->data);
        if (lVar4 != 0x18) {
          do {
            if ((uint32_t *)pHVar5->key != (uint32_t *)0x0 &&
                (uint32_t *)pHVar5->key != &deleted_key_value) {
              raviX_hash_table_insert_pre_hashed(ht,pHVar5->hash,pHVar5->key,pHVar5->data);
            }
            pHVar5 = pHVar5 + 1;
          } while (pHVar5 != ptr + uVar3);
        }
        break;
      }
      lVar4 = lVar4 + -0x18;
      pHVar2 = pHVar5;
    } while (lVar4 != 0);
  }
  raviX_free(ptr);
  return;
}

Assistant:

static void
hash_table_rehash(HashTable *ht, int new_size_index)
{
	HashTable old_ht;
	HashEntry *table, *entry;

	if (new_size_index >= ARRAY_SIZE(hash_sizes))
		return;

	table = (HashEntry *) raviX_calloc(hash_sizes[new_size_index].size, sizeof(*ht->table));

	old_ht = *ht;

	ht->table = table;
	ht->size_index = new_size_index;
	ht->size = hash_sizes[ht->size_index].size;
	ht->rehash = hash_sizes[ht->size_index].rehash;
	ht->max_entries = hash_sizes[ht->size_index].max_entries;
	ht->entries = 0;
	ht->deleted_entries = 0;

	hash_table_foreach(&old_ht, entry) {
		raviX_hash_table_insert_pre_hashed(ht, entry->hash,
					     entry->key, entry->data);
	}

	raviX_free(old_ht.table);
}